

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.h
# Opt level: O3

int __thiscall CVmBigNumCacheReg::alloc_mem(CVmBigNumCacheReg *this,size_t siz)

{
  int iVar1;
  char *pcVar2;
  ulong __size;
  
  iVar1 = 0;
  if (this->siz_ < siz) {
    __size = siz + 0x3f & 0xffffffffffffffc0;
    if (this->buf_ != (char *)0x0) {
      free(this->buf_);
    }
    this->siz_ = __size;
    pcVar2 = (char *)malloc(__size);
    this->buf_ = pcVar2;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int alloc_mem(size_t siz)
    {
        /* 
         *   if I'm already at least this large, there's no need to change
         *   anything 
         */
        if (siz_ >= siz)
            return FALSE;

        /* 
         *   round up the size a bit - this will avoid repeatedly
         *   reallocating at slightly different sizes, which could
         *   fragment the heap quite a bit; we'll use a little more memory
         *   than the caller actually asked for, but if they come back and
         *   ask for slightly more next time, an additional allocation
         *   probably won't be necessary, which will save memory in the
         *   long run 
         */
        siz = (siz + 63) & ~63;

        /* delete any existing memory */
        free_mem();
        
        /* remember the new size */
        siz_ = siz;

        /* allocate the memory */
        buf_ = (char *)t3malloc(siz_);

        /* indicate that we allocated memory */
        return TRUE;
    }